

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_frommesh.cpp
# Opt level: O1

ON_NgonBoundaryComponent * __thiscall
ON_NgonBoundaryChecker::Internal_AddEdge
          (ON_NgonBoundaryChecker *this,uint vertex_index0,uint vertex_index1,bool bMustBeOriented)

{
  ON_NgonBoundaryComponent *pOVar1;
  uint uVar2;
  ON_NgonBoundaryComponent *pOVar3;
  ON_NgonBoundaryComponent *pOVar4;
  ON_NgonBoundaryComponent *pOVar5;
  
  if (this->m_bIsNotSimple != false) {
    return (ON_NgonBoundaryComponent *)0x0;
  }
  if (vertex_index0 != vertex_index1) {
    pOVar3 = Internal_AddVertex(this,vertex_index0);
    pOVar4 = Internal_AddVertex(this,vertex_index1);
    if (pOVar3 != (ON_NgonBoundaryComponent *)0x0 && pOVar4 != (ON_NgonBoundaryComponent *)0x0) {
      uVar2 = Internal_EdgeHashIndex(0,0x61cc78);
      pOVar5 = this->m_hash_table[uVar2];
      while( true ) {
        if (pOVar5 == (ON_NgonBoundaryComponent *)0x0) {
          pOVar5 = (ON_NgonBoundaryComponent *)ON_FixedSizePool::AllocateElement(&this->m_fsp);
          pOVar5->m_type = Edge;
          pOVar5->m_face_count = '\x01';
          pOVar5->m_attached_count = '\x02';
          pOVar5->m_attached_to[0] = pOVar3;
          pOVar5->m_attached_to[1] = pOVar4;
          pOVar5->m_next = this->m_hash_table[uVar2];
          this->m_hash_table[uVar2] = pOVar5;
          this->m_edge_count = this->m_edge_count + 1;
          return pOVar5;
        }
        if ((pOVar5->m_type == Edge) &&
           (((pOVar1 = pOVar5->m_attached_to[0], pOVar1 == pOVar3 &&
             (pOVar5->m_attached_to[1] == pOVar4)) ||
            ((pOVar1 == pOVar4 && (pOVar5->m_attached_to[1] == pOVar3)))))) break;
        pOVar5 = pOVar5->m_next;
      }
      if ((pOVar5->m_face_count == '\x01') &&
         ((!bMustBeOriented || ((pOVar1 == pOVar4 && (pOVar5->m_attached_to[1] == pOVar3)))))) {
        pOVar5->m_face_count = '\x02';
        return pOVar5;
      }
    }
  }
  this->m_bIsSimple = false;
  this->m_bIsNotSimple = true;
  return (ON_NgonBoundaryComponent *)0x0;
}

Assistant:

ON_NgonBoundaryComponent* ON_NgonBoundaryChecker::Internal_AddEdge(unsigned int vertex_index0, unsigned int vertex_index1, bool bMustBeOriented)
{
  if (m_bIsNotSimple)
    return nullptr;

  if (vertex_index0 == vertex_index1)
  {
    Internal_ReturnIsNotSimple();
    return nullptr;
  }

  ON_NgonBoundaryComponent* v[2] = { Internal_AddVertex(vertex_index0), Internal_AddVertex(vertex_index1) };
  if (nullptr == v[0] || nullptr == v[1])
  {
    Internal_ReturnIsNotSimple();
    return nullptr;
  }

  const unsigned hash_index = ON_NgonBoundaryChecker::Internal_EdgeHashIndex(vertex_index0, vertex_index1);
  ON_NgonBoundaryComponent* e;
  for (
    e = m_hash_table[hash_index];
    nullptr != e;
    e = e->m_next
    )
  {
    if (
      ON_NgonBoundaryComponent::Type::Edge == e->m_type
      &&
      ((e->m_attached_to[0] == v[0] && e->m_attached_to[1] == v[1]) || (e->m_attached_to[0] == v[1] && e->m_attached_to[1] == v[0]))
      )
    {
      if (1 == e->m_face_count)
      {
        if (bMustBeOriented)
        {
          if (e->m_attached_to[0] != v[1] || e->m_attached_to[1] != v[0])
          {
            // The 2 faces attached to this edge are not compatibly oriented.
            Internal_ReturnIsNotSimple();
            return nullptr;
          }
        }
        // this is an interior edge
        e->m_face_count = 2;
        return e;
      }
      // nonmanifold edge
      Internal_ReturnIsNotSimple();
      return nullptr;
    }
  }

  e = (ON_NgonBoundaryComponent*)m_fsp.AllocateElement();
  e->m_type = ON_NgonBoundaryComponent::Type::Edge;
  e->m_face_count = 1;
  e->m_attached_count = 2;
  e->m_attached_to[0] = v[0];
  e->m_attached_to[1] = v[1];
  e->m_next = m_hash_table[hash_index];
  m_hash_table[hash_index] = e;
  ++m_edge_count;
  return e;
}